

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_markdown_generator.cc
# Opt level: O2

void __thiscall t_markdown_generator::print_doc(t_markdown_generator *this,t_doc *tdoc)

{
  string local_30;
  
  if (tdoc->has_doc_ == true) {
    if (this->unsafe_ == true) {
      std::operator<<((ostream *)&this->f_out_,(string *)&tdoc->doc_);
      return;
    }
    escape_html(&local_30,this,&tdoc->doc_);
    std::operator<<((ostream *)&this->f_out_,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void t_markdown_generator::print_doc(t_doc* tdoc) {
  if (tdoc->has_doc()) {
    if (unsafe_) {
      f_out_ << tdoc->get_doc();
    } else {
      f_out_ << escape_html(tdoc->get_doc());
    }
  }
}